

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  code *extraout_RDX;
  ulong uVar10;
  ulong uVar11;
  secp256k1_scalar *ng;
  secp256k1_gej *r_00;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  secp256k1_fe tmp;
  secp256k1_strauss_state sStack_b80;
  secp256k1_scalar sStack_b68;
  secp256k1_gej sStack_b48;
  secp256k1_gej sStack_ab0;
  secp256k1_ge sStack_a18;
  secp256k1_fe asStack_9b0 [8];
  secp256k1_ge asStack_830 [8];
  secp256k1_strauss_point_state sStack_4f0;
  secp256k1_fe *psStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  secp256k1_fe *psStack_c0;
  secp256k1_modinv64_signed62 *psStack_b8;
  code *pcStack_b0;
  long local_a0;
  ulong local_98;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe local_68;
  undefined8 uVar6;
  
  pcStack_b0 = (code *)0x15164b;
  secp256k1_fe_verify(x);
  local_a0 = 0x1000003d1;
  uVar4 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar14 = (uVar4 >> 0x34) + x->n[1];
  uVar7 = (uVar14 >> 0x34) + x->n[2];
  uVar8 = (uVar7 >> 0x34) + x->n[3];
  local_98 = (uVar8 >> 0x34) + (x->n[4] & 0xffffffffffff);
  uVar10 = (uVar4 ^ 0x1000003d0) & uVar14 & uVar7 & uVar8 & (local_98 ^ 0xf000000000000);
  pcStack_b0 = (code *)0x1516e8;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  pcStack_b0 = (code *)0x151711;
  secp256k1_fe_normalize_var(&local_68);
  local_90.v[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  uVar12 = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_90.v[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_90.v[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_90.v[4] = local_68.n[4] >> 0x28;
  pcStack_b0 = (code *)0x1517a3;
  local_90.v[1] = uVar12;
  secp256k1_modinv64_var(&local_90,&secp256k1_const_modinfo_fe);
  pcStack_b0 = (code *)0x1517ae;
  secp256k1_fe_from_signed62(r,&local_90);
  r->magnitude = (uint)(0 < x->magnitude);
  r->normalized = 1;
  pcStack_b0 = (code *)0x1517ca;
  secp256k1_fe_verify(r);
  r_00 = (secp256k1_gej *)(r->n[4] & 0xffffffffffff);
  uVar5 = (r->n[4] >> 0x30) * local_a0 + r->n[0];
  uVar2 = (uVar5 >> 0x34) + r->n[1];
  uVar9 = (uVar2 >> 0x34) + r->n[2];
  uVar11 = (uVar9 >> 0x34) + r->n[3];
  ng = (secp256k1_scalar *)((long)(r_00->x).n + (uVar11 >> 0x34));
  uVar13 = (uVar5 ^ 0x1000003d0) & uVar2 & uVar9 & uVar11 & ((ulong)ng ^ 0xf000000000000);
  bVar3 = uVar13 == 0xfffffffffffff ||
          ((uVar2 | uVar5 | uVar9 | uVar11) & 0xfffffffffffff) == 0 && ng == (secp256k1_scalar *)0x0
  ;
  uVar6 = CONCAT71(0xfffffffffff,bVar3);
  uVar2 = (uVar14 | uVar4 | uVar7 | uVar8) & 0xfffffffffffff | local_98;
  if ((uVar10 != 0xfffffffffffff && uVar2 != 0) != bVar3) {
    secp256k1_fe_verify(r);
    return;
  }
  pcStack_b0 = secp256k1_ecmult_multi_simple_var;
  secp256k1_fe_inv_var_cold_1();
  psStack_d8 = r;
  uStack_d0 = uVar13;
  uStack_c8 = uVar2;
  psStack_c0 = x;
  psStack_b8 = &local_90;
  pcStack_b0 = (code *)uVar10;
  secp256k1_gej_set_infinity(r_00);
  secp256k1_gej_set_infinity(&sStack_ab0);
  sStack_b48.x.n[0] = (uint64_t)asStack_9b0;
  sStack_b48.x.n[1] = (uint64_t)asStack_830;
  sStack_b48.x.n[2] = (uint64_t)&sStack_4f0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_b48,r_00,1,&sStack_ab0,&secp256k1_scalar_zero,ng);
  if (uVar12 != 0) {
    uVar2 = 0;
    do {
      iVar1 = (*extraout_RDX)(&sStack_b68,&sStack_a18,uVar2,uVar6);
      if (iVar1 == 0) {
        return;
      }
      secp256k1_gej_set_ge(&sStack_b48,&sStack_a18);
      sStack_b80.aux = asStack_9b0;
      sStack_b80.pre_a = asStack_830;
      sStack_b80.ps = &sStack_4f0;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_b80,&sStack_ab0,1,&sStack_b48,&sStack_b68,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r_00,r_00,&sStack_ab0,(secp256k1_fe *)0x0);
      uVar2 = uVar2 + 1;
    } while (uVar12 != uVar2);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}